

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void selection_handles_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  bool local_152;
  Am_Style local_f0;
  Am_Style local_e8;
  int local_dc;
  int local_d8;
  int height;
  int width;
  int top;
  int left;
  Am_Style local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object win;
  int offy;
  int offx;
  int y2;
  int x2;
  int y1;
  int x1;
  Am_Object handle_shape;
  Am_Object local_80;
  Am_Move_Grow_Where_Attach local_74;
  Am_Move_Grow_Where_Attach special_style_where;
  Am_Style special_style;
  Am_Object local_60;
  Am_Object sel_handles_widget;
  Am_Style style;
  undefined1 local_48 [7];
  bool as_line;
  Am_Value value;
  Am_Object local_28;
  Am_Object for_obj;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *draw_local;
  Am_Object *self_local;
  
  for_obj.data._0_4_ = y_offset;
  for_obj.data._4_4_ = x_offset;
  Am_Object::Am_Object(&local_28);
  pAVar7 = Am_Object::Get(self,0xa3,0);
  Am_Object::operator=(&local_28,pAVar7);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_48);
    pAVar7 = Am_Object::Peek(&local_28,0xdb,0);
    Am_Value::operator=((Am_Value *)local_48,pAVar7);
    bVar1 = Am_Value::Valid((Am_Value *)local_48);
    Am_Style::Am_Style((Am_Style *)&sel_handles_widget);
    pAVar7 = Am_Object::Get(self,0x6a,0);
    Am_Style::operator=((Am_Style *)&sel_handles_widget,pAVar7);
    Am_Object::Get_Owner((Am_Object *)&special_style,(Am_Slot_Flags)self);
    Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)&special_style);
    Am_Object::~Am_Object((Am_Object *)&special_style);
    bVar2 = Am_Style::Valid((Am_Style *)&sel_handles_widget);
    if (!bVar2) {
      pAVar7 = Am_Object::Get(&local_60,0x6a,0);
      Am_Style::operator=((Am_Style *)&sel_handles_widget,pAVar7);
    }
    Am_Style::Am_Style((Am_Style *)&stack0xffffffffffffff90,&Am_No_Style);
    local_74.value = Am_ATTACH_WHERE_HIT.value;
    pAVar7 = Am_Object::Peek(&local_60,0x1a3,0);
    Am_Value::operator=((Am_Value *)local_48,pAVar7);
    bVar2 = Am_Value::Valid((Am_Value *)local_48);
    if (bVar2) {
      Am_Style::operator=((Am_Style *)&stack0xffffffffffffff90,(Am_Value *)local_48);
      pAVar7 = Am_Object::Peek(&local_60,0x1a4,0);
      Am_Value::operator=((Am_Value *)local_48,pAVar7);
      handle_shape.data._7_1_ = 0;
      bVar2 = Am_Value::Valid((Am_Value *)local_48);
      local_152 = false;
      if (bVar2) {
        Am_Object::Am_Object(&local_80,(Am_Value *)local_48);
        handle_shape.data._7_1_ = 1;
        local_152 = Am_Object::operator==(&local_80,&local_28);
      }
      if ((handle_shape.data._7_1_ & 1) != 0) {
        Am_Object::~Am_Object(&local_80);
      }
      if (local_152 != false) {
        pAVar7 = Am_Object::Get(&local_60,0x1a5,0);
        Am_Move_Grow_Where_Attach::Am_Move_Grow_Where_Attach
                  ((Am_Move_Grow_Where_Attach *)&handle_shape,pAVar7);
        local_74.value = (Am_Move_Grow_Where_Attach_vals)handle_shape.data;
      }
    }
    pAVar7 = Am_Object::Peek(&local_60,0x1a7,0);
    Am_Object::Am_Object((Am_Object *)&y1,pAVar7);
    if (bVar1) {
      pAVar7 = Am_Object::Get(&local_28,0x8b,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_28,0x8c,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_28,0x8d,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&local_28,0x8e,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(self,0x68,0);
      Am_Object::Am_Object(&local_b0,pAVar7);
      Am_Object::Get_Owner(&local_b8,(Am_Slot_Flags)&local_28);
      Am_Translate_Coordinates(&local_b8,0,0,&local_b0,(int *)((long)&win.data + 4),(int *)&win);
      Am_Object::~Am_Object(&local_b8);
      Am_Style::Am_Style(&local_c0,(Am_Style *)&sel_handles_widget);
      Am_Style::Am_Style((Am_Style *)&left,(Am_Style *)&stack0xffffffffffffff90);
      top = local_74.value;
      draw_2_handles_for_line
                (iVar3 + win.data._4_4_,iVar4 + (int)win.data,iVar5 + win.data._4_4_,
                 iVar6 + (int)win.data,true,draw,&local_c0,(Am_Object *)&y1,(Am_Style *)&left,
                 local_74);
      Am_Style::~Am_Style((Am_Style *)&left);
      Am_Style::~Am_Style(&local_c0);
      Am_Object::~Am_Object(&local_b0);
    }
    else {
      pAVar7 = Am_Object::Get(self,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      width = iVar3 + for_obj.data._4_4_;
      pAVar7 = Am_Object::Get(self,0x65,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      height = iVar3 + (int)for_obj.data;
      pAVar7 = Am_Object::Get(self,0x66,0);
      local_d8 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(self,0x67,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      iVar5 = width;
      iVar4 = height;
      iVar3 = local_d8;
      local_dc = iVar6;
      Am_Style::Am_Style(&local_e8,(Am_Style *)&sel_handles_widget);
      Am_Style::Am_Style(&local_f0,(Am_Style *)&stack0xffffffffffffff90);
      draw_8_handles_for_rect
                (iVar5,iVar4,iVar3,iVar6,true,draw,&local_e8,(Am_Object *)&y1,&local_f0,local_74);
      Am_Style::~Am_Style(&local_f0);
      Am_Style::~Am_Style(&local_e8);
    }
    Am_Object::~Am_Object((Am_Object *)&y1);
    Am_Style::~Am_Style((Am_Style *)&stack0xffffffffffffff90);
    Am_Object::~Am_Object(&local_60);
    Am_Style::~Am_Style((Am_Style *)&sel_handles_widget);
    Am_Value::~Am_Value((Am_Value *)local_48);
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, selection_handles_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  Am_Object for_obj;
  for_obj = self.Get(Am_ITEM);

  if (for_obj.Valid()) { //otherwise don't draw anything
    Am_Value value;
    value = for_obj.Peek(Am_AS_LINE);
    bool as_line = value.Valid();

    Am_Style style;
    style = self.Get(Am_FILL_STYLE);
    Am_Object sel_handles_widget = self.Get_Owner().Get_Owner();
    if (!style.Valid()) {
      //get from owner's owner so don't need a constraint
      //owner must be valid if I am being drawn
      style = sel_handles_widget.Get(Am_FILL_STYLE);
    }
    Am_Style special_style = Am_No_Style;
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT; //0
    value = sel_handles_widget.Peek(Am_SELECT_CLOSEST_POINT_STYLE);
    if (value.Valid()) {
      special_style = value;
      value = sel_handles_widget.Peek(Am_SELECT_CLOSEST_POINT_OBJ);
      if (value.Valid() && Am_Object(value) == for_obj) {
        special_style_where = (Am_Move_Grow_Where_Attach)sel_handles_widget.Get(
            Am_SELECT_CLOSEST_POINT_WHERE);
      }
    }

    // supports multiple users
    Am_Object handle_shape = sel_handles_widget.Peek(Am_SPECIAL_HANDLE);

    // std::cout << "--Drawing " << self << " for obj " << for_obj << " as line "
    //	 << as_line << " l,t,w,h (" << left << ","
    //	 << top << "," << width << "," << height << ")\n" <<std::flush;
    if (as_line) {
      int x1 = for_obj.Get(Am_X1);
      int y1 = for_obj.Get(Am_Y1);
      int x2 = for_obj.Get(Am_X2);
      int y2 = for_obj.Get(Am_Y2);
      int offx, offy;
      Am_Object win = self.Get(Am_WINDOW);
      Am_Translate_Coordinates(for_obj.Get_Owner(), 0, 0, win, offx, offy);
      draw_2_handles_for_line(x1 + offx, y1 + offy, x2 + offx, y2 + offy, true,
                              draw, style,
                              handle_shape, // supports multiple users
                              special_style, special_style_where);
    } else {
      int left = (int)self.Get(Am_LEFT) + x_offset;
      int top = (int)self.Get(Am_TOP) + y_offset;
      int width = self.Get(Am_WIDTH);
      int height = self.Get(Am_HEIGHT);
      draw_8_handles_for_rect(left, top, width, height, true, draw, style,
                              handle_shape, // supports multiple users
                              special_style, special_style_where);
    }
  }
}